

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowSize(char *name,ImVec2 *size,ImGuiSetCond cond)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  int iVar4;
  
  pIVar3 = FindWindowByName(name);
  if ((pIVar3 != (ImGuiWindow *)0x0) && (cond == 0 || (pIVar3->SetWindowSizeAllowFlags & cond) != 0)
     ) {
    fVar1 = size->x;
    fVar2 = size->y;
    pIVar3->SetWindowSizeAllowFlags = pIVar3->SetWindowSizeAllowFlags & 0xfffffff1;
    if (fVar1 <= 0.0) {
      pIVar3->AutoFitOnlyGrows = false;
      iVar4 = 2;
    }
    else {
      (pIVar3->SizeFull).x = fVar1;
      iVar4 = 0;
    }
    pIVar3->AutoFitFramesX = iVar4;
    if (fVar2 <= 0.0) {
      pIVar3->AutoFitFramesY = 2;
      pIVar3->AutoFitOnlyGrows = false;
    }
    else {
      pIVar3->AutoFitFramesY = 0;
      (pIVar3->SizeFull).y = fVar2;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(const char* name, const ImVec2& size, ImGuiSetCond cond)
{
    ImGuiWindow* window = FindWindowByName(name);
    if (window)
        SetWindowSize(window, size, cond);
}